

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O1

ShaderType vk::getGluShaderType(VkShaderStageFlagBits shaderStage)

{
  switch(shaderStage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    return SHADERTYPE_VERTEX;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    return SHADERTYPE_TESSELLATION_CONTROL;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
       VK_SHADER_STAGE_VERTEX_BIT:
    goto switchD_009f0241_caseD_3;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    return SHADERTYPE_TESSELLATION_EVALUATION;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    return SHADERTYPE_GEOMETRY;
  default:
    if (shaderStage == VK_SHADER_STAGE_FRAGMENT_BIT) {
      return SHADERTYPE_FRAGMENT;
    }
    if (shaderStage == VK_SHADER_STAGE_COMPUTE_BIT) {
      return SHADERTYPE_COMPUTE;
    }
switchD_009f0241_caseD_3:
    return SHADERTYPE_LAST;
  }
}

Assistant:

glu::ShaderType getGluShaderType (VkShaderStageFlagBits shaderStage)
{
	switch (shaderStage)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:					return glu::SHADERTYPE_VERTEX;
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:		return glu::SHADERTYPE_TESSELLATION_CONTROL;
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:	return glu::SHADERTYPE_TESSELLATION_EVALUATION;
		case VK_SHADER_STAGE_GEOMETRY_BIT:					return glu::SHADERTYPE_GEOMETRY;
		case VK_SHADER_STAGE_FRAGMENT_BIT:					return glu::SHADERTYPE_FRAGMENT;
		case VK_SHADER_STAGE_COMPUTE_BIT:					return glu::SHADERTYPE_COMPUTE;
		default:
			DE_FATAL("Unknown shader stage");
			return glu::SHADERTYPE_LAST;
	}
}